

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::AuthenticatedStream>
kj::anon_unknown_0::NetworkAddressImpl::connectImpl
          (LowLevelAsyncIoProvider *lowLevel,NetworkFilter *filter,
          ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs,bool authenticated)

{
  PromiseArena *pPVar1;
  OwnPromiseNode node;
  undefined8 uVar2;
  undefined8 uVar3;
  char *node_00;
  char cVar4;
  void *pvVar5;
  PromiseArena *pPVar6;
  SocketAddress *params;
  Exception *e;
  TransformPromiseNodeBase *this;
  undefined7 in_register_00000081;
  PromiseArena *pPVar7;
  undefined1 in_R9B;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  OwnPromiseNode local_548;
  PromiseArena *local_540;
  undefined1 local_538 [56];
  PromiseDisposer local_500 [8];
  undefined1 local_4f8 [16];
  char *local_4e8;
  undefined8 uStack_4e0;
  bool local_4d8;
  undefined7 uStack_4d7;
  Fault local_360 [51];
  Exception local_1c8;
  
  pPVar7 = (PromiseArena *)CONCAT71(in_register_00000081,authenticated);
  pPVar6 = (PromiseArena *)addrs.size_;
  params = addrs.ptr;
  local_4f8._8_8_ = local_4f8._8_8_ & 0xffffffff00000000;
  local_4e8 = " > ";
  uStack_4e0 = 4;
  local_4d8 = pPVar7 != (PromiseArena *)0x0;
  local_540 = (PromiseArena *)filter;
  local_538._48_8_ = lowLevel;
  local_4f8._0_8_ = pPVar7;
  if (pPVar7 == (PromiseArena *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x665,FAILED,"addrs.size() > 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_4f8);
    kj::_::Debug::Fault::fatal(local_360);
  }
  local_548.ptr = (PromiseNode *)0x0;
  local_538._32_8_ = params;
  cVar4 = (*(code *)**(undefined8 **)params)(params,pPVar6->bytes + 8,*(undefined4 *)pPVar6->bytes);
  if (cVar4 == '\0') {
    kj::_::Debug::makeDescription<char_const(&)[37]>
              ((String *)local_538,(Debug *)"\"connect() blocked by restrictPeers()\"",
               "connect() blocked by restrictPeers()",(char (*) [37])params);
    Exception::Exception
              (&local_1c8,FAILED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x669,(String *)local_538);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              (local_500,&local_1c8);
    local_538[0x28] = local_500[0];
    local_538[0x29] = local_500[1];
    local_538[0x2a] = local_500[2];
    local_538[0x2b] = local_500[3];
    local_538[0x2c] = local_500[4];
    local_538[0x2d] = local_500[5];
    local_538[0x2e] = local_500[6];
    local_538[0x2f] = local_500[7];
    Exception::~Exception(&local_1c8);
    uVar3 = local_538._8_8_;
    uVar2 = local_538._0_8_;
    if ((char *)local_538._0_8_ != (char *)0x0) {
      local_538._0_8_ = (char *)0x0;
      local_538._8_8_ = 0;
      (*(code *)**(undefined8 **)local_538._16_8_)(local_538._16_8_,uVar2,1,uVar3,uVar3,0);
    }
  }
  else {
    SocketAddress::socket((SocketAddress *)local_538,(int)addrs.size_,1,(int)params);
    LowLevelAsyncIoProvider::wrapConnectingSocketFd
              ((LowLevelAsyncIoProvider *)(local_538 + 0x28),(OwnFd *)local_540,
               (sockaddr *)local_538,(uint)(pPVar6->bytes + 8),*(uint *)pPVar6->bytes);
    OwnFd::~OwnFd((OwnFd *)local_538);
  }
  uVar2 = local_538._40_8_;
  local_4f8._0_8_ = local_4f8._0_8_ & 0xffffffffffffff00;
  local_360[0].exception._0_1_ = (PromiseDisposer)0x0;
  local_548.ptr = (PromiseNode *)local_538._40_8_;
  pPVar1 = *(PromiseArena **)(local_538._40_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_538._40_8_ - (long)pPVar1) < 0x70) {
    pvVar5 = operator_new(0x400);
    this = (TransformPromiseNodeBase *)((long)pvVar5 + 0x390);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_548,
               kj::_::
               TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1647:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1656:8)>
               ::anon_class_40_4_9eb916ad_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x390) = &PTR_destroy_0070d9a8;
    *(PromiseArena **)((long)pvVar5 + 0x3b0) = local_540;
    *(undefined8 *)((long)pvVar5 + 0x3b8) = local_538._32_8_;
    *(PromiseArena **)((long)pvVar5 + 0x3c0) = pPVar6;
    *(PromiseArena **)((long)pvVar5 + 0x3c8) = pPVar7;
    *(undefined1 *)((long)pvVar5 + 0x3d0) = in_R9B;
    *(PromiseArena **)((long)pvVar5 + 0x3d8) = local_540;
    *(undefined8 *)((long)pvVar5 + 0x3e0) = local_538._32_8_;
    *(PromiseArena **)((long)pvVar5 + 1000) = pPVar6;
    *(PromiseArena **)((long)pvVar5 + 0x3f0) = pPVar7;
    *(undefined1 *)((long)pvVar5 + 0x3f8) = in_R9B;
    *(void **)((long)pvVar5 + 0x398) = pvVar5;
  }
  else {
    *(PromiseArena **)(local_538._40_8_ + 8) = (PromiseArena *)0x0;
    this = (TransformPromiseNodeBase *)(local_538._40_8_ + -0x70);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_548,
               kj::_::
               TransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1647:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1656:8)>
               ::anon_class_40_4_9eb916ad_for_func::operator());
    ((PromiseArenaMember *)(uVar2 + -0x70))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0070d9a8;
    ((PromiseArenaMember *)(uVar2 + -0x50))->_vptr_PromiseArenaMember = (_func_int **)local_540;
    *(undefined8 *)(uVar2 + -0x48) = local_538._32_8_;
    ((PromiseArenaMember *)(uVar2 + -0x40))->_vptr_PromiseArenaMember = (_func_int **)pPVar6;
    *(PromiseArena **)(uVar2 + -0x38) = pPVar7;
    *(undefined1 *)&((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember = in_R9B;
    *(PromiseArena **)(uVar2 + -0x28) = local_540;
    ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)local_538._32_8_;
    *(PromiseArena **)(uVar2 + -0x18) = pPVar6;
    ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)pPVar7;
    *(undefined1 *)(uVar2 + -8) = in_R9B;
    *(PromiseArena **)(uVar2 + -0x68) = pPVar1;
  }
  local_4f8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
  ;
  local_4f8._8_8_ = "connectImpl";
  local_4e8 = (char *)0xc00000667;
  local_1c8.ownFile.content.ptr = (char *)this;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_360,(OwnPromiseNode *)&local_1c8,(SourceLocation *)local_4f8);
  node_00 = local_1c8.ownFile.content.ptr;
  uVar2 = local_538._48_8_;
  *(ulong *)local_538._48_8_ = CONCAT71(local_360[0].exception._1_7_,local_360[0].exception._0_1_);
  if ((TransformPromiseNodeBase *)local_1c8.ownFile.content.ptr != (TransformPromiseNodeBase *)0x0)
  {
    local_1c8.ownFile.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
  }
  node.ptr = local_548.ptr;
  if (&(local_548.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_548.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (Promise<kj::AuthenticatedStream>)(PromiseNode *)uVar2;
}

Assistant:

static Promise<AuthenticatedStream> connectImpl(
      LowLevelAsyncIoProvider& lowLevel,
      LowLevelAsyncIoProvider::NetworkFilter& filter,
      ArrayPtr<SocketAddress> addrs,
      bool authenticated) {
    KJ_ASSERT(addrs.size() > 0);

    return kj::evalNow([&]() -> Promise<Own<AsyncIoStream>> {
      if (!addrs[0].allowedBy(filter)) {
        return KJ_EXCEPTION(FAILED, "connect() blocked by restrictPeers()");
      } else {
        auto fd = addrs[0].socket(SOCK_STREAM);
        return lowLevel.wrapConnectingSocketFd(
            kj::mv(fd), addrs[0].getRaw(), addrs[0].getRawSize(), NEW_FD_FLAGS);
      }
    }).then([&lowLevel,&filter,addrs,authenticated](Own<AsyncIoStream>&& stream)
        -> Promise<AuthenticatedStream> {
      // Success, pass along.
      AuthenticatedStream result;
      result.stream = kj::mv(stream);
      if (authenticated) {
        result.peerIdentity = addrs[0].getIdentity(lowLevel, filter, *result.stream);
      }
      return kj::mv(result);
    }, [&lowLevel,&filter,addrs,authenticated](Exception&& exception) mutable
        -> Promise<AuthenticatedStream> {
      // Connect failed.
      if (addrs.size() > 1) {
        // Try the next address instead.
        return connectImpl(lowLevel, filter, addrs.slice(1, addrs.size()), authenticated);
      } else {
        // No more addresses to try, so propagate the exception.
        return kj::mv(exception);
      }
    });
  }